

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_image_utils.cpp
# Opt level: O0

bool crnlib::image_utils::compute_delta(image_u8 *dest,image_u8 *a,image_u8 *b,uint scale)

{
  uint uVar1;
  byte bVar2;
  byte bVar3;
  uint uVar4;
  uint uVar5;
  int iVar6;
  uchar *puVar7;
  color_quad<unsigned_char,_int> *this;
  int in_ECX;
  image<crnlib::color_quad<unsigned_char,_int>_> *in_RDX;
  image<crnlib::color_quad<unsigned_char,_int>_> *in_RSI;
  image<crnlib::color_quad<unsigned_char,_int>_> *in_RDI;
  uint unaff_retaddr;
  uint unaff_retaddr_00;
  image<crnlib::color_quad<unsigned_char,_int>_> *in_stack_00000008;
  int d;
  uint c;
  color_quad_u8 cd;
  color_quad_u8 *cb;
  color_quad_u8 *ca;
  uint x;
  uint y;
  uint local_48;
  color_quad<unsigned_char,_int> local_44;
  color_quad<unsigned_char,_int> *local_40;
  color_quad<unsigned_char,_int> *local_38;
  uint local_30;
  uint local_2c;
  int local_24;
  image<crnlib::color_quad<unsigned_char,_int>_> *local_20;
  image<crnlib::color_quad<unsigned_char,_int>_> *local_18;
  uint in_stack_fffffffffffffffc;
  
  local_24 = in_ECX;
  local_20 = in_RDX;
  local_18 = in_RSI;
  uVar4 = image<crnlib::color_quad<unsigned_char,_int>_>::get_width(in_RSI);
  uVar5 = image<crnlib::color_quad<unsigned_char,_int>_>::get_width(local_20);
  if (uVar4 == uVar5) {
    uVar4 = image<crnlib::color_quad<unsigned_char,_int>_>::get_height(local_18);
    uVar5 = image<crnlib::color_quad<unsigned_char,_int>_>::get_height(local_20);
    if (uVar4 == uVar5) {
      image<crnlib::color_quad<unsigned_char,_int>_>::get_width(local_18);
      image<crnlib::color_quad<unsigned_char,_int>_>::get_height(local_20);
      color_quad<unsigned_char,_int>::make_black();
      image<crnlib::color_quad<unsigned_char,_int>_>::resize
                (in_stack_00000008,unaff_retaddr_00,unaff_retaddr,in_stack_fffffffffffffffc,
                 (color_quad<unsigned_char,_int> *)in_RDI);
      for (local_2c = 0; uVar1 = local_2c,
          uVar4 = image<crnlib::color_quad<unsigned_char,_int>_>::get_height(local_18),
          uVar1 < uVar4; local_2c = local_2c + 1) {
        for (local_30 = 0; uVar1 = local_30,
            uVar4 = image<crnlib::color_quad<unsigned_char,_int>_>::get_width(local_18),
            uVar1 < uVar4; local_30 = local_30 + 1) {
          local_38 = image<crnlib::color_quad<unsigned_char,_int>_>::operator()
                               (local_18,local_30,local_2c);
          local_40 = image<crnlib::color_quad<unsigned_char,_int>_>::operator()
                               (local_20,local_30,local_2c);
          color_quad<unsigned_char,_int>::color_quad(&local_44);
          for (local_48 = 0; local_48 < 4; local_48 = local_48 + 1) {
            bVar2 = color_quad<unsigned_char,_int>::operator[](local_38,local_48);
            bVar3 = color_quad<unsigned_char,_int>::operator[](local_40,local_48);
            iVar6 = math::clamp<int>(((uint)bVar2 - (uint)bVar3) * local_24 + 0x80,0,0xff);
            puVar7 = color_quad<unsigned_char,_int>::operator[](&local_44,local_48);
            *puVar7 = (uchar)iVar6;
          }
          this = image<crnlib::color_quad<unsigned_char,_int>_>::operator()
                           (in_RDI,local_30,local_2c);
          color_quad<unsigned_char,_int>::operator=(this,&local_44);
        }
      }
      return true;
    }
  }
  return false;
}

Assistant:

bool compute_delta(image_u8& dest, image_u8& a, image_u8& b, uint scale) {
  if ((a.get_width() != b.get_width()) || (a.get_height() != b.get_height()))
    return false;

  dest.resize(a.get_width(), b.get_height());

  for (uint y = 0; y < a.get_height(); y++) {
    for (uint x = 0; x < a.get_width(); x++) {
      const color_quad_u8& ca = a(x, y);
      const color_quad_u8& cb = b(x, y);

      color_quad_u8 cd;
      for (uint c = 0; c < 4; c++) {
        int d = (ca[c] - cb[c]) * scale + 128;
        d = math::clamp(d, 0, 255);
        cd[c] = static_cast<uint8>(d);
      }

      dest(x, y) = cd;
    }
  }

  return true;
}